

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

TypedDeleter<LLVMBC::FunctionType> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::FunctionType>,LLVMBC::FunctionType*&>
          (LLVMContext *this,FunctionType **u)

{
  TypedDeleter<LLVMBC::FunctionType> *this_00;
  TypedDeleter<LLVMBC::FunctionType> *t;
  TypedDeleter<LLVMBC::FunctionType> *mem;
  FunctionType **u_local;
  LLVMContext *this_local;
  
  this_00 = (TypedDeleter<LLVMBC::FunctionType> *)allocate(this,0x10,8);
  if (this_00 == (TypedDeleter<LLVMBC::FunctionType> *)0x0) {
    std::terminate();
  }
  TypedDeleter<LLVMBC::FunctionType>::TypedDeleter(this_00,*u);
  return this_00;
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}